

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall soplex::SPxDevexPR<double>::selectEnterX(SPxDevexPR<double> *this,double tol)

{
  SPxSolverBase<double> *pSVar1;
  DataKey *pDVar2;
  double bestCo;
  double best;
  SPxId enterId;
  SPxId enterCoId;
  double local_30;
  double local_28;
  DataKey local_20;
  double local_18;
  DataKey local_10;
  
  local_20.info = 0;
  local_20.idx = -1;
  local_10.info = 0;
  local_10.idx = -1;
  local_28 = 0.0;
  local_30 = 0.0;
  this->last = 1.0;
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  local_18 = tol;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) goto LAB_0020cb1b;
      local_10 = (DataKey)buildBestPriceVectorEnterDim(this,&local_28,tol);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      local_10 = (DataKey)selectEnterHyperDim(this,&local_28,tol);
    }
    else {
LAB_0020cb1b:
      local_10 = (DataKey)selectEnterDenseDim(this,&local_28,tol,0,1);
    }
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       (pSVar1 = (this->super_SPxPricer<double>).thesolver,
       (pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) {
        local_20 = (DataKey)buildBestPriceVectorEnterCoDim(this,&local_30,local_18);
        goto LAB_0020cb90;
      }
    }
    else if (pSVar1->sparsePricingEnterCo == true) {
      local_20 = (DataKey)selectEnterHyperCoDim(this,&local_30,local_18);
      goto LAB_0020cb90;
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      local_10 = (DataKey)selectEnterSparseDim(this,&local_28,tol);
    }
    else {
      local_10 = (DataKey)selectEnterDenseDim(this,&local_28,tol,0,1);
    }
    if ((((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) &&
       (this->refined == false)) {
      local_20 = (DataKey)selectEnterSparseCoDim(this,&local_30,local_18);
      goto LAB_0020cb90;
    }
  }
  local_20 = (DataKey)selectEnterDenseCoDim(this,&local_30,local_18,0,1);
LAB_0020cb90:
  if ((local_10.info == 0) ||
     ((pDVar2 = &local_10, local_28 <= local_30 * 0.8 && (local_20.info != 0)))) {
    pDVar2 = &local_20;
  }
  return (SPxId)*pDVar2;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}